

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O2

_Bool expand_vec_cmp_noinv
                (TCGContext_conflict9 *tcg_ctx,TCGType_conflict type,uint vece,TCGv_vec v0,
                TCGv_vec v1,TCGv_vec v2,TCGCond cond)

{
  uint uVar1;
  TCGv_vec r;
  TCGv_vec pTVar2;
  uintptr_t o_2;
  TCGv_vec pTVar3;
  uintptr_t o_1;
  uintptr_t o_3;
  TCGArg c;
  uintptr_t o_4;
  bool bVar4;
  ulong uVar5;
  _Bool local_40;
  
  c = (TCGArg)cond;
  bVar4 = true;
  pTVar3 = v1;
  switch(cond) {
  case TCG_COND_LT:
    local_40 = false;
    uVar5 = c;
    goto LAB_00b25fef;
  case TCG_COND_GE:
    uVar5 = 3;
    goto LAB_00b25fd6;
  case TCG_COND_LTU:
    bVar4 = 2 < vece;
    uVar5 = 0x11;
    if (bVar4) {
      uVar5 = 6;
    }
    break;
  case TCG_COND_GEU:
    bVar4 = vece >= 3;
    uVar5 = (ulong)((uint)(vece < 3) * 9 + 7);
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
               ,0xdbb,(char *)0x0);
  case TCG_COND_EQ:
  case TCG_COND_GT:
    local_40 = false;
    goto LAB_00b26013;
  case TCG_COND_NE:
  case TCG_COND_LE:
    uVar5 = 0;
    goto LAB_00b25fd6;
  case TCG_COND_LEU:
    bVar4 = vece >= 3;
    uVar5 = (ulong)((uint)(vece < 3) * 3 + 5);
    break;
  case TCG_COND_GTU:
    bVar4 = vece >= 3;
    uVar5 = (ulong)((uint)(vece < 3) * 5 + 4);
  }
  if ((uVar5 & 1) == 0) {
    local_40 = false;
  }
  else {
LAB_00b25fd6:
    c = (TCGArg)(cond ^ TCG_COND_ALWAYS);
    local_40 = true;
  }
  pTVar2 = v2;
  if ((uVar5 & 2) != 0) {
LAB_00b25fef:
    pTVar2 = v1;
    pTVar3 = v2;
    if ((c & 6) != 0) {
      c = (TCGArg)((uint)c ^ 9);
    }
  }
  if (bVar4) {
    v2 = pTVar2;
    if ((uVar5 & 4) == 0) {
LAB_00b26013:
      r = (TCGv_vec)0x0;
      pTVar2 = (TCGv_vec)0x0;
    }
    else {
      r = tcg_temp_new_vec_tricore(tcg_ctx,type);
      v2 = tcg_temp_new_vec_tricore(tcg_ctx,type);
      tcg_gen_dupi_vec_tricore(tcg_ctx,vece,v2,1L << ((char)(8 << ((byte)vece & 0x1f)) - 1U & 0x3f))
      ;
      tcg_gen_sub_vec_tricore(tcg_ctx,vece,r,pTVar3,v2);
      tcg_gen_sub_vec_tricore(tcg_ctx,vece,v2,pTVar2,v2);
      uVar1 = (uint)c ^ 6;
      if ((c & 4) == 0) {
        uVar1 = (uint)c;
      }
      c = (TCGArg)uVar1;
      pTVar3 = r;
      pTVar2 = v2;
    }
  }
  else {
    v2 = tcg_temp_new_vec_tricore(tcg_ctx,type);
    if ((uVar5 & 8) == 0) {
      tcg_gen_umax_vec_tricore(tcg_ctx,vece,v2,pTVar3,pTVar2);
    }
    else {
      tcg_gen_umin_vec_tricore(tcg_ctx,vece,v2,pTVar3,pTVar2);
    }
    c = 8;
    pTVar2 = (TCGv_vec)0x0;
    r = v2;
  }
  vec_gen_4_tricore(tcg_ctx,INDEX_op_cmp_vec,type,vece,(TCGArg)(v0 + (long)tcg_ctx),
                    (TCGArg)(pTVar3 + (long)tcg_ctx),(TCGArg)(v2 + (long)tcg_ctx),c);
  if ((r != (TCGv_vec)0x0) &&
     (tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(r + (long)tcg_ctx)),
     pTVar2 != (TCGv_vec)0x0)) {
    tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  }
  return local_40;
}

Assistant:

static bool expand_vec_cmp_noinv(TCGContext *tcg_ctx, TCGType type, unsigned vece, TCGv_vec v0,
                                 TCGv_vec v1, TCGv_vec v2, TCGCond cond)
{
    enum {
        NEED_INV  = 1,
        NEED_SWAP = 2,
        NEED_BIAS = 4,
        NEED_UMIN = 8,
        NEED_UMAX = 16,
    };
    TCGv_vec t1, t2;
    uint8_t fixup = 0;

    switch (cond) {
    case TCG_COND_EQ:
    case TCG_COND_GT:
        fixup = 0;
        break;
    case TCG_COND_NE:
    case TCG_COND_LE:
        fixup = NEED_INV;
        break;
    case TCG_COND_LT:
        fixup = NEED_SWAP;
        break;
    case TCG_COND_GE:
        fixup = NEED_SWAP | NEED_INV;
        break;
    case TCG_COND_LEU:
        if (vece <= MO_32) {
            fixup = NEED_UMIN;
        } else {
            fixup = NEED_BIAS | NEED_INV;
        }
        break;
    case TCG_COND_GTU:
        if (vece <= MO_32) {
            fixup = NEED_UMIN | NEED_INV;
        } else {
            fixup = NEED_BIAS;
        }
        break;
    case TCG_COND_GEU:
        if (vece <= MO_32) {
            fixup = NEED_UMAX;
        } else {
            fixup = NEED_BIAS | NEED_SWAP | NEED_INV;
        }
        break;
    case TCG_COND_LTU:
        if (vece <= MO_32) {
            fixup = NEED_UMAX | NEED_INV;
        } else {
            fixup = NEED_BIAS | NEED_SWAP;
        }
        break;
    default:
        g_assert_not_reached();
    }

    if (fixup & NEED_INV) {
        cond = tcg_invert_cond(cond);
    }
    if (fixup & NEED_SWAP) {
        t1 = v1, v1 = v2, v2 = t1;
        cond = tcg_swap_cond(cond);
    }

    t1 = t2 = NULL;
    if (fixup & (NEED_UMIN | NEED_UMAX)) {
        t1 = tcg_temp_new_vec(tcg_ctx, type);
        if (fixup & NEED_UMIN) {
            tcg_gen_umin_vec(tcg_ctx, vece, t1, v1, v2);
        } else {
            tcg_gen_umax_vec(tcg_ctx, vece, t1, v1, v2);
        }
        v2 = t1;
        cond = TCG_COND_EQ;
    } else if (fixup & NEED_BIAS) {
        t1 = tcg_temp_new_vec(tcg_ctx, type);
        t2 = tcg_temp_new_vec(tcg_ctx, type);
        tcg_gen_dupi_vec(tcg_ctx, vece, t2, 1ull << ((8 << vece) - 1));
        tcg_gen_sub_vec(tcg_ctx, vece, t1, v1, t2);
        tcg_gen_sub_vec(tcg_ctx, vece, t2, v2, t2);
        v1 = t1;
        v2 = t2;
        cond = tcg_signed_cond(cond);
    }

    tcg_debug_assert(cond == TCG_COND_EQ || cond == TCG_COND_GT);
    /* Expand directly; do not recurse.  */
    vec_gen_4(tcg_ctx, INDEX_op_cmp_vec, type, vece,
              tcgv_vec_arg(tcg_ctx, v0), tcgv_vec_arg(tcg_ctx, v1), tcgv_vec_arg(tcg_ctx, v2), cond);

    if (t1) {
        tcg_temp_free_vec(tcg_ctx, t1);
        if (t2) {
            tcg_temp_free_vec(tcg_ctx, t2);
        }
    }
    return fixup & NEED_INV;
}